

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O2

void test_bson_iter_find_descendant(void)

{
  char cVar1;
  int iVar2;
  bson_t *pbVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char *pcVar7;
  bson_iter_t desc;
  bson_iter_t iter;
  undefined8 in_stack_fffffffffffffe18;
  undefined4 uVar8;
  undefined1 local_180 [128];
  undefined1 local_100 [232];
  
  uVar8 = (undefined4)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  pbVar3 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/dotkey.bson"
                   );
  cVar1 = bson_iter_init(local_100,pbVar3);
  if (cVar1 == '\0') {
    pcVar7 = "bson_iter_init (&iter, b)";
    uVar6 = 0x21a;
  }
  else {
    cVar1 = bson_iter_find_descendant(local_100,"a.b.c.0",local_180);
    if (cVar1 == '\0') {
      pcVar7 = "bson_iter_find_descendant (&iter, \"a.b.c.0\", &desc)";
      uVar6 = 0x21b;
    }
    else {
      iVar2 = bson_iter_type(local_180);
      if (iVar2 == 0x10) {
        iVar2 = bson_iter_int32(local_180);
        if (iVar2 == 1) {
          bson_destroy(pbVar3);
          uVar4 = bson_bcon_magic();
          uVar6 = uVar4;
          uVar5 = bcon_new(0,"foo","{","bar","[","{","baz",uVar4,0xf,CONCAT44(uVar8,1),"}","]","}",0
                          );
          uVar8 = (undefined4)((ulong)uVar6 >> 0x20);
          cVar1 = bson_iter_init(local_100,uVar5);
          if (cVar1 == '\0') {
            pcVar7 = "bson_iter_init (&iter, b)";
            uVar6 = 0x222;
          }
          else {
            cVar1 = bson_iter_find_descendant(local_100,"foo.bar.0.baz",local_180);
            if (cVar1 == '\0') {
              pcVar7 = "bson_iter_find_descendant (&iter, \"foo.bar.0.baz\", &desc)";
              uVar6 = 0x223;
            }
            else {
              iVar2 = bson_iter_type(local_180);
              if (iVar2 == 0x10) {
                iVar2 = bson_iter_int32(local_180);
                if (iVar2 == 1) {
                  bson_destroy(uVar5);
                  uVar5 = CONCAT44(uVar8,0xf);
                  uVar6 = bcon_new(0,"nModified",uVar4,0xf,1,"n",uVar4,uVar5,2,0);
                  uVar8 = (undefined4)((ulong)uVar5 >> 0x20);
                  cVar1 = bson_iter_init(local_100,uVar6);
                  if (cVar1 == '\0') {
                    pcVar7 = "bson_iter_init (&iter, b)";
                    uVar6 = 0x229;
                  }
                  else {
                    cVar1 = bson_iter_find_descendant(local_100,"n",local_180);
                    if (cVar1 == '\0') {
                      pcVar7 = "bson_iter_find_descendant (&iter, \"n\", &desc)";
                      uVar6 = 0x22a;
                    }
                    else {
                      pcVar7 = (char *)bson_iter_key(local_180);
                      if ((*pcVar7 == 'n') && (pcVar7[1] == '\0')) {
                        bson_destroy(uVar6);
                        uVar6 = bcon_new(0,"",uVar4,0xf,1,"n",uVar4,CONCAT44(uVar8,0xf),2,0);
                        cVar1 = bson_iter_init(local_100,uVar6);
                        if (cVar1 == '\0') {
                          pcVar7 = "bson_iter_init (&iter, b)";
                          uVar6 = 0x22f;
                        }
                        else {
                          cVar1 = bson_iter_find_descendant(local_100,"n",local_180);
                          if (cVar1 == '\0') {
                            pcVar7 = "bson_iter_find_descendant (&iter, \"n\", &desc)";
                            uVar6 = 0x230;
                          }
                          else {
                            pcVar7 = (char *)bson_iter_key(local_180);
                            if ((*pcVar7 == 'n') && (pcVar7[1] == '\0')) {
                              bson_destroy(uVar6);
                              return;
                            }
                            pcVar7 = "!strcmp (bson_iter_key (&desc), \"n\")";
                            uVar6 = 0x231;
                          }
                        }
                      }
                      else {
                        pcVar7 = "!strcmp (bson_iter_key (&desc), \"n\")";
                        uVar6 = 0x22b;
                      }
                    }
                  }
                }
                else {
                  pcVar7 = "bson_iter_int32 (&desc) == 1";
                  uVar6 = 0x225;
                }
              }
              else {
                pcVar7 = "BSON_ITER_HOLDS_INT32 (&desc)";
                uVar6 = 0x224;
              }
            }
          }
        }
        else {
          pcVar7 = "bson_iter_int32 (&desc) == 1";
          uVar6 = 0x21d;
        }
      }
      else {
        pcVar7 = "BSON_ITER_HOLDS_INT32 (&desc)";
        uVar6 = 0x21c;
      }
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
          uVar6,"test_bson_iter_find_descendant",pcVar7);
  abort();
}

Assistant:

static void
test_bson_iter_find_descendant (void)
{
   bson_iter_t iter;
   bson_iter_t desc;
   bson_t *b;

   b = get_bson (BINARY_DIR "/dotkey.bson");
   BSON_ASSERT (bson_iter_init (&iter, b));
   BSON_ASSERT (bson_iter_find_descendant (&iter, "a.b.c.0", &desc));
   BSON_ASSERT (BSON_ITER_HOLDS_INT32 (&desc));
   BSON_ASSERT (bson_iter_int32 (&desc) == 1);
   bson_destroy (b);

   b = BCON_NEW (
      "foo", "{", "bar", "[", "{", "baz", BCON_INT32 (1), "}", "]", "}");
   BSON_ASSERT (bson_iter_init (&iter, b));
   BSON_ASSERT (bson_iter_find_descendant (&iter, "foo.bar.0.baz", &desc));
   BSON_ASSERT (BSON_ITER_HOLDS_INT32 (&desc));
   BSON_ASSERT (bson_iter_int32 (&desc) == 1);
   bson_destroy (b);

   b = BCON_NEW ("nModified", BCON_INT32 (1), "n", BCON_INT32 (2));
   BSON_ASSERT (bson_iter_init (&iter, b));
   BSON_ASSERT (bson_iter_find_descendant (&iter, "n", &desc));
   BSON_ASSERT (!strcmp (bson_iter_key (&desc), "n"));
   bson_destroy (b);

   b = BCON_NEW ("", BCON_INT32 (1), "n", BCON_INT32 (2));
   BSON_ASSERT (bson_iter_init (&iter, b));
   BSON_ASSERT (bson_iter_find_descendant (&iter, "n", &desc));
   BSON_ASSERT (!strcmp (bson_iter_key (&desc), "n"));
   bson_destroy (b);
}